

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void showProcessInfo(void)

{
  Process *pPVar1;
  bool bVar2;
  _Setiosflags _Var3;
  _Setw _Var4;
  ostream *poVar5;
  size_type sVar6;
  reference ppPVar7;
  Process *i;
  iterator __end1;
  iterator __begin1;
  list<Process_*,_std::allocator<Process_*>_> *__range1;
  
  printSplitLine();
  poVar5 = std::operator<<((ostream *)&std::cout,"main process info:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tnum: ");
  sVar6 = std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::size(&processList_abi_cxx11_);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"details: ");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = std::operator<<((ostream *)&std::cout,"\tpid \tname\t\t\tmem");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  __end1 = std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::begin(&processList_abi_cxx11_)
  ;
  i = (Process *)
      std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::end(&processList_abi_cxx11_);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&i);
    if (!bVar2) break;
    ppPVar7 = std::_List_iterator<Process_*>::operator*(&__end1);
    pPVar1 = *ppPVar7;
    poVar5 = std::operator<<((ostream *)&std::cout,"\t");
    _Var3 = std::setiosflags(_S_left);
    poVar5 = std::operator<<(poVar5,_Var3);
    _Var4 = std::setw(7);
    poVar5 = std::operator<<(poVar5,_Var4);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar1->pid);
    poVar5 = std::operator<<(poVar5," ");
    _Var3 = std::setiosflags(_S_left);
    poVar5 = std::operator<<(poVar5,_Var3);
    _Var4 = std::setw(0xf);
    poVar5 = std::operator<<(poVar5,_Var4);
    poVar5 = std::operator<<(poVar5,pPVar1->name);
    poVar5 = std::operator<<(poVar5," ");
    _Var3 = std::setiosflags(_S_left);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pPVar1->memBlock->length);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::_List_iterator<Process_*>::operator++(&__end1);
  }
  sVar6 = std::__cxx11::list<Process_*,_std::allocator<Process_*>_>::size(&processList_abi_cxx11_);
  if (sVar6 == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"\tnone");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  printSplitLine();
  return;
}

Assistant:

void showProcessInfo() {
    printSplitLine();
    // 先输出进程数量
    cout << "main process info:" << endl;
    cout << "\tnum: " << processList.size() << endl;
    cout << endl;
    // 输出线程详情
    cout << "details: " << endl;
    cout << "\tpid \tname\t\t\tmem" << endl;
    for (Process *i : processList)
        cout << "\t" << setiosflags(ios::left) << setw(7) << i->pid
             << " " << setiosflags(ios::left) << setw(15) << i->name
             << " " << setiosflags(ios::left) << i->memBlock->length
             << endl;
    if (processList.size() == 0) cout << "\tnone" << endl;
    printSplitLine();
}